

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O0

bool cmAddSubDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  cmMakefile *this;
  string *psVar3;
  ulong uVar4;
  char *pcVar5;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar6;
  string local_2b0;
  char local_289;
  string local_288;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  string local_228;
  size_type local_208;
  size_t binLen;
  size_t srcLen;
  string *bin;
  string *src;
  undefined1 local_1c8 [8];
  string binPath;
  undefined1 local_188 [8];
  string error;
  string local_160;
  undefined1 local_140 [8];
  string srcPath;
  string local_118;
  undefined4 local_f8;
  allocator<char> local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_98;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  undefined1 local_88 [6];
  bool system;
  bool excludeFromAll;
  string binArg;
  string *srcArg;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_003f5dc1;
  }
  this = cmExecutionStatus::GetMakefile(local_20);
  binArg.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)status_local);
  std::__cxx11::string::string((string *)local_88);
  __range1._7_1_ = 0;
  __range1._6_1_ = 0;
  cVar6 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
  __begin1 = cVar6.Begin._M_current;
  local_a8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&__begin1,1);
  local_98 = &local_a8;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_98);
  arg = (string *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_98);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar2) break;
    local_d0 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar2 = std::operator==(local_d0,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      __range1._7_1_ = 1;
    }
    else {
      bVar2 = std::operator==(local_d0,"SYSTEM");
      if (bVar2) {
        __range1._6_1_ = 1;
      }
      else {
        uVar4 = std::__cxx11::string::empty();
        pcVar1 = local_20;
        if ((uVar4 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,"called with incorrect number of arguments",&local_f1);
          cmExecutionStatus::SetError(pcVar1,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator(&local_f1);
          args_local._7_1_ = 0;
          local_f8 = 1;
          goto LAB_003f5dab;
        }
        std::__cxx11::string::operator=((string *)local_88,(string *)local_d0);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"SYSTEM",(allocator<char> *)(srcPath.field_2._M_local_buf + 0xf));
  bVar2 = cmMakefile::GetPropertyAsBool(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)(srcPath.field_2._M_local_buf + 0xf));
  if (bVar2) {
    __range1._6_1_ = 1;
  }
  std::__cxx11::string::string((string *)local_140);
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)binArg.field_2._8_8_);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_140,(string *)binArg.field_2._8_8_);
  }
  else {
    psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    error.field_2._M_local_buf[0xf] = '/';
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              (&local_160,psVar3,error.field_2._M_local_buf + 0xf,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               binArg.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_140,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_140);
  if (bVar2) {
    psVar3 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this);
    cmsys::SystemTools::CollapseFullPath
              ((string *)((long)&binPath.field_2 + 8),(string *)local_140,psVar3);
    std::__cxx11::string::operator=
              ((string *)local_140,(string *)(binPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(binPath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_1c8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_88);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_1c8,(string *)local_88);
      }
      else {
        psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        local_289 = '/';
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                  (&local_288,psVar3,&local_289,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
        std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_288);
        std::__cxx11::string::~string((string *)&local_288);
      }
LAB_003f5cee:
      cmsys::SystemTools::CollapseFullPath(&local_2b0,(string *)local_1c8);
      std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      cmMakefile::AddSubDirectory
                (this,(string *)local_140,(string *)local_1c8,(bool)(__range1._7_1_ & 1),true,
                 (bool)(__range1._6_1_ & 1));
      args_local._7_1_ = 1;
    }
    else {
      psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      bVar2 = cmsys::SystemTools::IsSubDirectory((string *)local_140,psVar3);
      pcVar1 = local_20;
      if (bVar2) {
        bin = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
        srcLen = (size_t)cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        binLen = std::__cxx11::string::length();
        local_208 = std::__cxx11::string::length();
        if (binLen != 0) {
          pcVar5 = (char *)std::__cxx11::string::back();
          if (*pcVar5 == '/') {
            binLen = binLen - 1;
          }
        }
        if (local_208 != 0) {
          pcVar5 = (char *)std::__cxx11::string::back();
          if (*pcVar5 == '/') {
            local_208 = local_208 - 1;
          }
        }
        local_248 = (basic_string_view<char,_std::char_traits<char>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)srcLen);
        local_238 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (&local_248,0,local_208);
        local_268 = (basic_string_view<char,_std::char_traits<char>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_140);
        local_258 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (&local_268,binLen,0xffffffffffffffff);
        cmStrCat<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_228,&local_238,&local_258);
        std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        goto LAB_003f5cee;
      }
      psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      cmStrCat<char_const(&)[51],char_const(&)[12],std::__cxx11::string&,char_const(&)[29],std::__cxx11::string_const&,char_const(&)[91]>
                ((string *)&src,(char (*) [51])"not given a binary directory but the given source ",
                 (char (*) [12])0x101f4c7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 (char (*) [29])"\" is not a subdirectory of \"",psVar3,
                 (char (*) [91])
                 "\".  When specifying an out-of-tree source a binary directory must be explicitly specified."
                );
      cmExecutionStatus::SetError(pcVar1,(string *)&src);
      std::__cxx11::string::~string((string *)&src);
      args_local._7_1_ = 0;
    }
    local_f8 = 1;
    std::__cxx11::string::~string((string *)local_1c8);
  }
  else {
    cmStrCat<char_const(&)[15],std::__cxx11::string_const&,char_const(&)[38]>
              ((string *)local_188,(char (*) [15])"given source \"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               binArg.field_2._8_8_,(char (*) [38])"\" which is not an existing directory.");
    cmExecutionStatus::SetError(local_20,(string *)local_188);
    args_local._7_1_ = 0;
    local_f8 = 1;
    std::__cxx11::string::~string((string *)local_188);
  }
  std::__cxx11::string::~string((string *)local_140);
LAB_003f5dab:
  std::__cxx11::string::~string((string *)local_88);
LAB_003f5dc1:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmAddSubDirectoryCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // store the binpath
  std::string const& srcArg = args.front();
  std::string binArg;

  bool excludeFromAll = false;
  bool system = false;

  // process the rest of the arguments looking for optional args
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (arg == "SYSTEM") {
      system = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = arg;
    } else {
      status.SetError("called with incorrect number of arguments");
      return false;
    }
  }
  // "SYSTEM" directory property should also affects targets in nested
  // subdirectories.
  if (mf.GetPropertyAsBool("SYSTEM")) {
    system = true;
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg)) {
    srcPath = srcArg;
  } else {
    srcPath = cmStrCat(mf.GetCurrentSourceDirectory(), '/', srcArg);
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = cmStrCat("given source \"", srcArg,
                                 "\" which is not an existing directory.");
    status.SetError(error);
    return false;
  }
  srcPath =
    cmSystemTools::CollapseFullPath(srcPath, mf.GetHomeOutputDirectory());

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(srcPath,
                                       mf.GetCurrentSourceDirectory())) {
      status.SetError(
        cmStrCat("not given a binary directory but the given source ",
                 "directory \"", srcPath, "\" is not a subdirectory of \"",
                 mf.GetCurrentSourceDirectory(),
                 "\".  When specifying an "
                 "out-of-tree source a binary directory must be explicitly "
                 "specified."));
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const std::string& src = mf.GetCurrentSourceDirectory();
    const std::string& bin = mf.GetCurrentBinaryDirectory();
    size_t srcLen = src.length();
    size_t binLen = bin.length();
    if (srcLen > 0 && src.back() == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin.back() == '/') {
      --binLen;
    }
    binPath = cmStrCat(cm::string_view(bin).substr(0, binLen),
                       cm::string_view(srcPath).substr(srcLen));
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg)) {
      binPath = binArg;
    } else {
      binPath = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', binArg);
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  mf.AddSubDirectory(srcPath, binPath, excludeFromAll, true, system);

  return true;
}